

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_unpack(bcf1_t *b,int which)

{
  int iVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  uint8_t *ptr_00;
  int32_t iVar4;
  void *pvVar5;
  byte *p;
  long lVar6;
  int *piVar7;
  undefined8 uStack_80;
  int aiStack_78 [2];
  kstring_t *local_70;
  int local_64;
  undefined1 auStack_60 [4];
  int type;
  kstring_t tmp;
  bcf_dec_t *d;
  int i;
  int *offset;
  uint8_t *ptr_ori;
  uint8_t *ptr;
  bcf1_t *pbStack_18;
  int which_local;
  bcf1_t *b_local;
  
  if ((b->shared).l != 0) {
    puVar2 = (uint8_t *)(b->shared).s;
    tmp.s = (char *)&b->d;
    ptr._4_4_ = which;
    if ((which & 2U) != 0) {
      ptr._4_4_ = which | 1;
    }
    if ((ptr._4_4_ & 4) != 0) {
      ptr._4_4_ = ptr._4_4_ | 7;
    }
    piVar7 = aiStack_78;
    pbStack_18 = b;
    if (((ptr._4_4_ & 1) != 0) && (piVar7 = aiStack_78, (b->unpacked & 1U) == 0)) {
      _auStack_60 = 0;
      tmp.m = (size_t)(b->d).id;
      tmp.l = (size_t)(b->d).m_id;
      local_70 = (kstring_t *)auStack_60;
      uStack_80 = 0x125424;
      ptr_ori = puVar2;
      ptr_ori = bcf_fmt_sized_array(local_70,puVar2);
      offset._0_4_ = (int)puVar2;
      pbStack_18->unpack_size[0] = (int)ptr_ori - (int)offset;
      uStack_80 = 0x125445;
      kputc(0,local_70);
      puVar2 = ptr_ori;
      *(size_t *)(tmp.s + 0x28) = tmp.m;
      *(undefined4 *)(tmp.s + 8) = (undefined4)tmp.l;
      _auStack_60 = 0;
      tmp.m = *(size_t *)(tmp.s + 0x30);
      tmp.l = (size_t)*(int *)(tmp.s + 0xc);
      lVar6 = -(ulong)((uint)*(ushort *)&pbStack_18->field_0x12 * 4 + 0xf & 0xfffffff0);
      piVar7 = (int *)((long)aiStack_78 + lVar6);
      for (d._4_4_ = 0; ptr_00 = ptr_ori,
          d._4_4_ < (int)((uint)((ulong)*(undefined8 *)&pbStack_18->field_0x10 >> 0x10) & 0xffff);
          d._4_4_ = d._4_4_ + 1) {
        *(int *)((long)piVar7 + (long)d._4_4_ * 4) = (int)_auStack_60;
        *(undefined8 *)((long)aiStack_78 + lVar6 + -8) = 0x1254e5;
        ptr_ori = bcf_fmt_sized_array((kstring_t *)auStack_60,ptr_00);
        *(undefined8 *)((long)aiStack_78 + lVar6 + -8) = 0x1254f4;
        kputc(0,(kstring_t *)auStack_60);
      }
      pbStack_18->unpack_size[1] = (int)ptr_ori - (int)puVar2;
      *(size_t *)(tmp.s + 0x30) = tmp.m;
      *(int *)(tmp.s + 0xc) = (int)tmp.l;
      if (*(int *)(tmp.s + 0x10) <
          (int)((uint)((ulong)*(undefined8 *)&pbStack_18->field_0x10 >> 0x10) & 0xffff)) {
        *(uint *)(tmp.s + 0x10) =
             (uint)((ulong)*(undefined8 *)&pbStack_18->field_0x10 >> 0x10) & 0xffff;
        *(int *)(tmp.s + 0x10) = *(int *)(tmp.s + 0x10) + -1;
        *(uint *)(tmp.s + 0x10) = *(int *)(tmp.s + 0x10) >> 1 | *(uint *)(tmp.s + 0x10);
        *(uint *)(tmp.s + 0x10) = *(int *)(tmp.s + 0x10) >> 2 | *(uint *)(tmp.s + 0x10);
        *(uint *)(tmp.s + 0x10) = *(int *)(tmp.s + 0x10) >> 4 | *(uint *)(tmp.s + 0x10);
        *(uint *)(tmp.s + 0x10) = *(int *)(tmp.s + 0x10) >> 8 | *(uint *)(tmp.s + 0x10);
        *(uint *)(tmp.s + 0x10) = *(int *)(tmp.s + 0x10) >> 0x10 | *(uint *)(tmp.s + 0x10);
        *(int *)(tmp.s + 0x10) = *(int *)(tmp.s + 0x10) + 1;
        pvVar5 = *(void **)(tmp.s + 0x38);
        iVar1 = *(int *)(tmp.s + 0x10);
        *(undefined8 *)((long)aiStack_78 + lVar6 + -8) = 0x1255ff;
        pvVar5 = realloc(pvVar5,(long)iVar1 << 3);
        *(void **)(tmp.s + 0x38) = pvVar5;
      }
      for (d._4_4_ = 0;
          d._4_4_ < (int)((uint)((ulong)*(undefined8 *)&pbStack_18->field_0x10 >> 0x10) & 0xffff);
          d._4_4_ = d._4_4_ + 1) {
        *(long *)(*(long *)(tmp.s + 0x38) + (long)d._4_4_ * 8) =
             *(long *)(tmp.s + 0x30) + (long)*(int *)((long)piVar7 + (long)d._4_4_ * 4);
      }
      pbStack_18->unpacked = pbStack_18->unpacked | 1;
    }
    if (((ptr._4_4_ & 2) != 0) && ((pbStack_18->unpacked & 2U) == 0)) {
      p = (byte *)((pbStack_18->shared).s +
                  (long)pbStack_18->unpack_size[1] + (long)pbStack_18->unpack_size[0]);
      if ((int)(uint)*p >> 4 == 0) {
        ptr_ori = p + 1;
        tmp.s[0x18] = '\0';
        tmp.s[0x19] = '\0';
        tmp.s[0x1a] = '\0';
        tmp.s[0x1b] = '\0';
      }
      else {
        ptr_ori = p;
        *(undefined8 *)((long)piVar7 + -8) = 0x1256e9;
        iVar4 = bcf_dec_size(p,&ptr_ori,&local_64);
        *(int32_t *)(tmp.s + 0x18) = iVar4;
        if (*(int *)(tmp.s + 0x14) < *(int *)(tmp.s + 0x18)) {
          *(undefined4 *)(tmp.s + 0x14) = *(undefined4 *)(tmp.s + 0x18);
          *(int *)(tmp.s + 0x14) = *(int *)(tmp.s + 0x14) + -1;
          *(uint *)(tmp.s + 0x14) = *(int *)(tmp.s + 0x14) >> 1 | *(uint *)(tmp.s + 0x14);
          *(uint *)(tmp.s + 0x14) = *(int *)(tmp.s + 0x14) >> 2 | *(uint *)(tmp.s + 0x14);
          *(uint *)(tmp.s + 0x14) = *(int *)(tmp.s + 0x14) >> 4 | *(uint *)(tmp.s + 0x14);
          *(uint *)(tmp.s + 0x14) = *(int *)(tmp.s + 0x14) >> 8 | *(uint *)(tmp.s + 0x14);
          *(uint *)(tmp.s + 0x14) = *(int *)(tmp.s + 0x14) >> 0x10 | *(uint *)(tmp.s + 0x14);
          *(int *)(tmp.s + 0x14) = *(int *)(tmp.s + 0x14) + 1;
          pvVar5 = *(void **)(tmp.s + 0x20);
          iVar1 = *(int *)(tmp.s + 0x14);
          *(undefined8 *)((long)piVar7 + -8) = 0x1257aa;
          pvVar5 = realloc(pvVar5,(long)iVar1 << 2);
          *(void **)(tmp.s + 0x20) = pvVar5;
        }
        for (d._4_4_ = 0; puVar2 = ptr_ori, iVar1 = local_64, d._4_4_ < *(int *)(tmp.s + 0x18);
            d._4_4_ = d._4_4_ + 1) {
          *(undefined8 *)((long)piVar7 + -8) = 0x1257d8;
          iVar4 = bcf_dec_int1(puVar2,iVar1,&ptr_ori);
          *(int32_t *)(*(long *)(tmp.s + 0x20) + (long)d._4_4_ * 4) = iVar4;
        }
      }
      pbStack_18->unpack_size[2] = (int)ptr_ori - (int)p;
      pbStack_18->unpacked = pbStack_18->unpacked | 2;
    }
    if (((ptr._4_4_ & 4) != 0) && ((pbStack_18->unpacked & 4U) == 0)) {
      ptr_ori = (uint8_t *)
                ((pbStack_18->shared).s +
                (long)pbStack_18->unpack_size[2] +
                (long)pbStack_18->unpack_size[1] + (long)pbStack_18->unpack_size[0]);
      if (*(int *)(tmp.s + 4) < (int)((uint)*(undefined8 *)&pbStack_18->field_0x10 & 0xffff)) {
        *(uint *)(tmp.s + 4) = (uint)*(undefined8 *)&pbStack_18->field_0x10 & 0xffff;
        *(int *)(tmp.s + 4) = *(int *)(tmp.s + 4) + -1;
        *(uint *)(tmp.s + 4) = *(int *)(tmp.s + 4) >> 1 | *(uint *)(tmp.s + 4);
        *(uint *)(tmp.s + 4) = *(int *)(tmp.s + 4) >> 2 | *(uint *)(tmp.s + 4);
        *(uint *)(tmp.s + 4) = *(int *)(tmp.s + 4) >> 4 | *(uint *)(tmp.s + 4);
        *(uint *)(tmp.s + 4) = *(int *)(tmp.s + 4) >> 8 | *(uint *)(tmp.s + 4);
        *(uint *)(tmp.s + 4) = *(int *)(tmp.s + 4) >> 0x10 | *(uint *)(tmp.s + 4);
        *(int *)(tmp.s + 4) = *(int *)(tmp.s + 4) + 1;
        pvVar5 = *(void **)(tmp.s + 0x40);
        iVar1 = *(int *)(tmp.s + 4);
        *(undefined8 *)((long)piVar7 + -8) = 0x12595a;
        pvVar5 = realloc(pvVar5,(long)iVar1 << 5);
        *(void **)(tmp.s + 0x40) = pvVar5;
      }
      for (d._4_4_ = 0; d._4_4_ < *(int *)(tmp.s + 4); d._4_4_ = d._4_4_ + 1) {
        lVar6 = *(long *)(tmp.s + 0x40) + (long)d._4_4_ * 0x20;
        *(uint *)(lVar6 + 0x1c) = *(uint *)(lVar6 + 0x1c) & 0x7fffffff;
      }
      for (d._4_4_ = 0; puVar2 = ptr_ori,
          d._4_4_ < (int)((uint)*(undefined8 *)&pbStack_18->field_0x10 & 0xffff);
          d._4_4_ = d._4_4_ + 1) {
        lVar6 = *(long *)(tmp.s + 0x40);
        *(undefined8 *)((long)piVar7 + -8) = 0x1259de;
        ptr_ori = bcf_unpack_info_core1(puVar2,(bcf_info_t *)(lVar6 + (long)d._4_4_ * 0x20));
      }
      pbStack_18->unpacked = pbStack_18->unpacked | 4;
    }
    if ((((ptr._4_4_ & 8) != 0) &&
        ((uint)((ulong)*(undefined8 *)&pbStack_18->field_0x10 >> 0x28) != 0)) &&
       ((pbStack_18->unpacked & 8U) == 0)) {
      ptr_ori = (uint8_t *)(pbStack_18->indiv).s;
      if (*(int *)tmp.s <
          (int)((uint)((ulong)*(undefined8 *)&pbStack_18->field_0x10 >> 0x20) & 0xff)) {
        *(uint *)tmp.s = (uint)((ulong)*(undefined8 *)&pbStack_18->field_0x10 >> 0x20) & 0xff;
        *(int *)tmp.s = *(int *)tmp.s + -1;
        *(uint *)tmp.s = *(int *)tmp.s >> 1 | *(uint *)tmp.s;
        *(uint *)tmp.s = *(int *)tmp.s >> 2 | *(uint *)tmp.s;
        *(uint *)tmp.s = *(int *)tmp.s >> 4 | *(uint *)tmp.s;
        *(uint *)tmp.s = *(int *)tmp.s >> 8 | *(uint *)tmp.s;
        *(uint *)tmp.s = *(int *)tmp.s >> 0x10 | *(uint *)tmp.s;
        *(int *)tmp.s = *(int *)tmp.s + 1;
        pvVar5 = *(void **)(tmp.s + 0x48);
        iVar1 = *(int *)tmp.s;
        *(undefined8 *)((long)piVar7 + -8) = 0x125b00;
        pvVar5 = realloc(pvVar5,(long)iVar1 << 5);
        *(void **)(tmp.s + 0x48) = pvVar5;
      }
      for (d._4_4_ = 0; d._4_4_ < *(int *)tmp.s; d._4_4_ = d._4_4_ + 1) {
        lVar6 = *(long *)(tmp.s + 0x48) + (long)d._4_4_ * 0x20;
        *(uint *)(lVar6 + 0x1c) = *(uint *)(lVar6 + 0x1c) & 0x7fffffff;
      }
      for (d._4_4_ = 0; puVar2 = ptr_ori,
          d._4_4_ < (int)((uint)((ulong)*(undefined8 *)&pbStack_18->field_0x10 >> 0x20) & 0xff);
          d._4_4_ = d._4_4_ + 1) {
        uVar3 = *(undefined8 *)&pbStack_18->field_0x10;
        lVar6 = *(long *)(tmp.s + 0x48);
        *(undefined8 *)((long)piVar7 + -8) = 0x125b95;
        ptr_ori = bcf_unpack_fmt_core1
                            (puVar2,(uint)((ulong)uVar3 >> 0x28),
                             (bcf_fmt_t *)(lVar6 + (long)d._4_4_ * 0x20));
      }
      pbStack_18->unpacked = pbStack_18->unpacked | 8;
    }
  }
  return 0;
}

Assistant:

int bcf_unpack(bcf1_t *b, int which)
{
    if ( !b->shared.l ) return 0; // Building a new BCF record from scratch
    uint8_t *ptr = (uint8_t*)b->shared.s, *ptr_ori;
    int *offset, i;
    bcf_dec_t *d = &b->d;
    if (which & BCF_UN_FLT) which |= BCF_UN_STR;
    if (which & BCF_UN_INFO) which |= BCF_UN_SHR;
    if ((which&BCF_UN_STR) && !(b->unpacked&BCF_UN_STR))
    {
        kstring_t tmp;

        // ID
        tmp.l = 0; tmp.s = d->id; tmp.m = d->m_id;
        ptr_ori = ptr;
        ptr = bcf_fmt_sized_array(&tmp, ptr);
        b->unpack_size[0] = ptr - ptr_ori;
        kputc('\0', &tmp);
        d->id = tmp.s; d->m_id = tmp.m;

        // REF and ALT are in a single block (d->als) and d->alleles are pointers into this block
        tmp.l = 0; tmp.s = d->als; tmp.m = d->m_als;
        offset = (int*)alloca(b->n_allele * sizeof(int));
        ptr_ori = ptr;
        for (i = 0; i < b->n_allele; ++i) {
            offset[i] = tmp.l;
            ptr = bcf_fmt_sized_array(&tmp, ptr);
            kputc('\0', &tmp);
        }
        b->unpack_size[1] = ptr - ptr_ori;
        d->als = tmp.s; d->m_als = tmp.m;

        hts_expand(char*, b->n_allele, d->m_allele, d->allele); // NM: hts_expand() is a macro
        for (i = 0; i < b->n_allele; ++i)
            d->allele[i] = d->als + offset[i];
        b->unpacked |= BCF_UN_STR;
    }
    if ((which&BCF_UN_FLT) && !(b->unpacked&BCF_UN_FLT)) { // FILTER
        ptr = (uint8_t*)b->shared.s + b->unpack_size[0] + b->unpack_size[1];
        ptr_ori = ptr;
        if (*ptr>>4) {
            int type;
            d->n_flt = bcf_dec_size(ptr, &ptr, &type);
            hts_expand(int, d->n_flt, d->m_flt, d->flt);
            for (i = 0; i < d->n_flt; ++i)
                d->flt[i] = bcf_dec_int1(ptr, type, &ptr);
        } else ++ptr, d->n_flt = 0;
        b->unpack_size[2] = ptr - ptr_ori;
        b->unpacked |= BCF_UN_FLT;
    }
    if ((which&BCF_UN_INFO) && !(b->unpacked&BCF_UN_INFO)) { // INFO
        ptr = (uint8_t*)b->shared.s + b->unpack_size[0] + b->unpack_size[1] + b->unpack_size[2];
        hts_expand(bcf_info_t, b->n_info, d->m_info, d->info);
        for (i = 0; i < d->m_info; ++i) d->info[i].vptr_free = 0;
        for (i = 0; i < b->n_info; ++i)
            ptr = bcf_unpack_info_core1(ptr, &d->info[i]);
        b->unpacked |= BCF_UN_INFO;
    }
    if ((which&BCF_UN_FMT) && b->n_sample && !(b->unpacked&BCF_UN_FMT)) { // FORMAT
        ptr = (uint8_t*)b->indiv.s;
        hts_expand(bcf_fmt_t, b->n_fmt, d->m_fmt, d->fmt);
        for (i = 0; i < d->m_fmt; ++i) d->fmt[i].p_free = 0;
        for (i = 0; i < b->n_fmt; ++i)
            ptr = bcf_unpack_fmt_core1(ptr, b->n_sample, &d->fmt[i]);
        b->unpacked |= BCF_UN_FMT;
    }
    return 0;
}